

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

void t_results_queue_destroy(t_results_queue *q)

{
  if (q != (t_results_queue *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)&q->result_m);
    pthread_cond_destroy((pthread_cond_t *)&q->result_avail_c);
    q->result_head = (t_pool_result *)0xbbbbbbbbbbbbbbbb;
    q->result_tail = (t_pool_result *)0xbbbbbbbbbbbbbbbb;
    q->next_serial = -0x44444445;
    q->curr_serial = -0x44444445;
    q->queue_len = -0x44444445;
    q->pending = -0x44444445;
    (q->result_m).__align = -0x4444444444444445;
    *(undefined8 *)((long)&q->result_m + 8) = 0xbbbbbbbbbbbbbbbb;
    *(undefined8 *)((long)&q->result_m + 0x10) = 0xbbbbbbbbbbbbbbbb;
    (q->result_m).__data.__list.__prev = (__pthread_internal_list *)0xbbbbbbbbbbbbbbbb;
    (q->result_m).__data.__list.__next = (__pthread_internal_list *)0xbbbbbbbbbbbbbbbb;
    (q->result_avail_c).__align = -0x4444444444444445;
    (q->result_avail_c).__data.__g1_start.__value64 = 0xbbbbbbbbbbbbbbbb;
    *(undefined8 *)((long)&q->result_avail_c + 0x10) = 0xbbbbbbbbbbbbbbbb;
    *(undefined8 *)((long)&q->result_avail_c + 0x18) = 0xbbbbbbbbbbbbbbbb;
    *(undefined8 *)((long)&q->result_avail_c + 0x20) = 0xbbbbbbbbbbbbbbbb;
    *(undefined8 *)((long)&q->result_avail_c + 0x28) = 0xbbbbbbbbbbbbbbbb;
    free(q);
    return;
  }
  return;
}

Assistant:

void t_results_queue_destroy(t_results_queue *q) {
#ifdef DEBUG
    fprintf(stderr, "Destroying results queue %p\n", q);
#endif

    if (!q)
	return;

    pthread_mutex_destroy(&q->result_m);
    pthread_cond_destroy(&q->result_avail_c);

    memset(q, 0xbb, sizeof(*q));
    free(q);

#ifdef DEBUG
    fprintf(stderr, "Destroyed results queue %p\n", q);
#endif
}